

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestState.h
# Opt level: O1

void __thiscall TestState::TestState(TestState *this,shared_ptr<GameData> *data)

{
  shared_ptr<GameData> local_18;
  
  local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  GameState::GameState(&this->super_GameState,&local_18);
  if (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->super_GameState)._vptr_GameState = (_func_int **)&PTR_processInput_00188760;
  return;
}

Assistant:

TestState(std::shared_ptr<GameData> data) : GameState(data) { }